

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRErrorCorrectionLevel.cpp
# Opt level: O3

ErrorCorrectionLevel ZXing::QRCode::ECLevelFromString(char *str)

{
  ErrorCorrectionLevel EVar1;
  
  EVar1 = Invalid;
  if ((byte)(*str + 0xb8U) < 10) {
    EVar1 = *(ErrorCorrectionLevel *)(&DAT_0019e244 + (ulong)(byte)(*str + 0xb8U) * 4);
  }
  return EVar1;
}

Assistant:

ErrorCorrectionLevel ECLevelFromString(const char* str)
{
	switch (str[0]) {
	case 'L': return ErrorCorrectionLevel::Low;
	case 'M': return ErrorCorrectionLevel::Medium;
	case 'Q': return ErrorCorrectionLevel::Quality;
	case 'H': return ErrorCorrectionLevel::High;
	default:  return ErrorCorrectionLevel::Invalid;
	}
}